

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_power_normalization.cc
# Opt level: O0

void __thiscall
sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
          (MelCepstrumPowerNormalization *this,int num_order,int impulse_response_length,
          double alpha)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  FrequencyTransform *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe4;
  
  *in_RDI = &PTR__MelCepstrumPowerNormalization_00129c08;
  FrequencyTransform::FrequencyTransform
            (in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(double)(in_RDI + 1)
            );
  CepstrumToAutocorrelation::CepstrumToAutocorrelation
            ((CepstrumToAutocorrelation *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_XMM0_Qa >> 0x20),
             (int)in_XMM0_Qa,in_stack_ffffffffffffffe4);
  *(undefined1 *)(in_RDI + 0x15) = 1;
  bVar1 = FrequencyTransform::IsValid((FrequencyTransform *)(in_RDI + 1));
  if ((!bVar1) ||
     (bVar1 = CepstrumToAutocorrelation::IsValid((CepstrumToAutocorrelation *)(in_RDI + 5)), !bVar1)
     ) {
    *(undefined1 *)(in_RDI + 0x15) = 0;
  }
  return;
}

Assistant:

MelCepstrumPowerNormalization::MelCepstrumPowerNormalization(
    int num_order, int impulse_response_length, double alpha)
    : frequency_transform_(num_order, impulse_response_length - 1, -alpha),
      cepstrum_to_autocorrelation_(impulse_response_length - 1, 0,
                                   impulse_response_length),
      is_valid_(true) {
  if (!frequency_transform_.IsValid() ||
      !cepstrum_to_autocorrelation_.IsValid()) {
    is_valid_ = false;
    return;
  }
}